

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw.cxx
# Opt level: O3

void fl_draw(char *str,int x,int y,int w,int h,Fl_Align align,
            _func_void_char_ptr_int_int_int *callthis,Fl_Image *img,int draw_symbols)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  Fl_Image *pFVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  char *pcVar17;
  char cVar18;
  uint uVar19;
  bool bVar20;
  bool bVar21;
  double extraout_XMM0_Qa;
  int buflen;
  double width;
  char *linebuf;
  char symbol [2] [255];
  int local_2bc;
  int local_27c;
  char *local_278;
  ulong local_270;
  double local_268;
  double local_260;
  char *local_258;
  int local_250;
  int local_24c;
  int local_248;
  uint local_244;
  double local_240;
  char local_238 [255];
  char local_139 [265];
  
  pFVar11 = (Fl_Image *)0x0;
  if ((align >> 9 & 1) == 0) {
    pFVar11 = img;
  }
  local_258 = (char *)0x0;
  if (img == (Fl_Image *)0x0) {
    pFVar11 = img;
  }
  local_238[0] = '\0';
  local_139[0] = '\0';
  if (draw_symbols == 0) {
LAB_001e9b93:
    iVar2 = 0;
    iVar3 = 0;
  }
  else {
    if (str == (char *)0x0) {
      str = (char *)0x0;
      goto LAB_001e9b93;
    }
    if ((*str == '@') && ((str[1] & 0xbfU) != 0)) {
      cVar18 = '@';
      uVar12 = 0;
      do {
        iVar3 = (int)cVar18;
        iVar2 = isspace(iVar3);
        if ((iVar2 != 0) || (0xfd < uVar12)) goto LAB_001e9fc7;
        uVar1 = uVar12 + 1;
        local_238[uVar12] = cVar18;
        cVar18 = str[uVar12 + 1];
        uVar12 = uVar1;
      } while (cVar18 != '\0');
      iVar3 = 0;
LAB_001e9fc7:
      local_238[uVar12] = '\0';
      iVar2 = isspace(iVar3);
      str = str + ((uVar12 + 1) - (ulong)(iVar2 == 0));
      iVar2 = h;
      if (w < h) {
        iVar2 = w;
      }
    }
    else {
      iVar2 = 0;
    }
    pcVar10 = strrchr(str,0x40);
    iVar3 = 0;
    if (((str + 1 < pcVar10 && pcVar10 != (char *)0x0) && (pcVar10[-1] != '@')) &&
       (fl_strlcpy(local_139,pcVar10,0xff), iVar3 = h, w < h)) {
      iVar3 = w;
    }
  }
  local_270 = 0;
  if (((align >> 8 & 1) != 0) && (pFVar11 != (Fl_Image *)0x0)) {
    local_270 = (ulong)(uint)pFVar11->w_;
  }
  local_278 = str;
  if (str != (char *)0x0) {
    iVar6 = (int)local_270;
    iVar8 = 0;
    local_2bc = 1;
    do {
      str = expand_text_(str,&local_258,0,(double)(w - (iVar3 + iVar2 + iVar6)),&local_27c,
                         &local_260,align & 0x80,draw_symbols);
      iVar4 = (int)local_260;
      if (local_260 <= (double)iVar8) {
        iVar4 = iVar8;
      }
      iVar8 = iVar4;
      if (*str == '@') {
        if ((draw_symbols != 0) && (str[1] != '@')) goto LAB_001e9c79;
      }
      else if (*str == '\0') goto LAB_001e9c79;
      local_2bc = local_2bc + 1;
    } while( true );
  }
  iVar8 = 0;
  local_2bc = 0;
LAB_001e9d13:
  bVar20 = (align >> 8 & 1) == 0;
  bVar21 = pFVar11 != (Fl_Image *)0x0;
  iVar4 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  iVar5 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  pcVar10 = local_278;
  iVar6 = 0;
  if (bVar21 && bVar20) {
    iVar6 = pFVar11->h_;
  }
  if ((align & 2) == 0) {
    if ((align & 1) == 0) {
      uVar16 = (h - (iVar5 * local_2bc + iVar6)) / 2 + y + iVar5;
    }
    else {
      uVar16 = y + iVar5;
    }
  }
  else {
    uVar16 = ((1 - local_2bc) * iVar5 + y + h) - iVar6;
  }
  iVar6 = iVar3 + iVar2;
  if ((char)((align & 0x20) >> 5) == '\0' && (bVar21 && bVar20)) {
    uVar9 = pFVar11->w_;
    uVar19 = 0;
    if (0 < (int)uVar9) {
      uVar19 = uVar9;
    }
    if ((align & 4) == 0) {
      if ((align & 8) == 0) {
        uVar12 = (ulong)(uint)((int)(w - (iVar6 + uVar9)) / 2 + x + iVar2);
      }
      else {
        uVar12 = (ulong)((w + x) - (iVar3 + uVar9));
      }
    }
    else {
      uVar12 = (ulong)(uint)(iVar2 + x);
    }
    uVar15 = 0;
    (*pFVar11->_vptr_Fl_Image[7])
              (pFVar11,uVar12,(ulong)(uVar16 - iVar5),(ulong)uVar9,(ulong)(uint)pFVar11->h_,0,0);
    uVar16 = uVar16 + pFVar11->h_;
    uVar9 = 0;
    goto LAB_001ea0a7;
  }
  if (pFVar11 == (Fl_Image *)0x0 || (align >> 8 & 1) == 0) {
    uVar15 = 0;
    uVar9 = 0;
  }
  else {
    uVar9 = pFVar11->w_;
    uVar12 = (ulong)uVar9;
    if ((align & 0x20) == 0) {
      iVar14 = iVar2;
      if ((align & 4) == 0) {
        if ((align & 8) == 0) {
          iVar14 = (int)(w - (iVar8 + iVar6 + uVar9)) / 2;
          goto LAB_001e9f9c;
        }
        uVar19 = ~(iVar8 + iVar3 + uVar9) + x + w;
      }
      else {
LAB_001e9f9c:
        uVar19 = (x + iVar14) - 1;
      }
      uVar15 = uVar9;
      uVar9 = 0;
    }
    else {
      if ((align & 4) == 0) {
        if ((align & 8) == 0) {
          iVar14 = iVar8 + x + iVar2;
          iVar8 = (int)(w - (iVar6 + iVar8 + uVar9)) / 2;
          goto LAB_001e9faf;
        }
        iVar14 = (w + x) - (iVar3 + uVar9);
      }
      else {
        iVar14 = iVar8 + x;
        iVar8 = iVar2;
LAB_001e9faf:
        iVar14 = iVar14 + iVar8;
      }
      uVar19 = iVar14 + 1;
      uVar15 = 0;
    }
    uVar13 = uVar16 - iVar5;
    if ((align & 1) == 0) {
      uVar7 = ~pFVar11->h_;
      if ((align & 2) == 0) {
        uVar7 = (int)(iVar4 * local_2bc + uVar7) / 2;
      }
      else {
        uVar13 = uVar13 + iVar4 * local_2bc;
      }
      uVar13 = uVar13 + uVar7;
    }
    (*pFVar11->_vptr_Fl_Image[7])
              (pFVar11,(ulong)uVar19,(ulong)uVar13,uVar12,(ulong)(uint)pFVar11->h_,0,0);
  }
  uVar19 = 0;
  pcVar10 = local_278;
LAB_001ea0a7:
  if (pcVar10 == (char *)0x0) {
LAB_001ea2f5:
    if (((align & 0x20) != 0) && (bVar21 && bVar20)) {
      uVar9 = pFVar11->w_;
      if ((int)uVar19 < (int)uVar9) {
        uVar19 = uVar9;
      }
      if ((align & 4) == 0) {
        if ((align & 8) == 0) {
          uVar12 = (ulong)(uint)((int)(w - (iVar6 + uVar9)) / 2 + x + iVar2);
        }
        else {
          uVar12 = (ulong)((w + x) - (iVar3 + uVar9));
        }
      }
      else {
        uVar12 = (ulong)(uint)(iVar2 + x);
      }
      (*pFVar11->_vptr_Fl_Image[7])
                (pFVar11,uVar12,(ulong)uVar16,(ulong)uVar9,(ulong)(uint)pFVar11->h_,0,0);
    }
    if (iVar2 != 0) {
      iVar8 = x;
      if ((align & 4) == 0) {
        if ((align & 8) == 0) {
          iVar8 = (int)(w - (iVar6 + uVar19)) / 2 + x;
        }
        else {
          iVar8 = (w + x) - (iVar6 + uVar19);
        }
      }
      if ((align & 2) == 0) {
        iVar4 = y;
        if ((align & 1) == 0) {
          iVar4 = (h - iVar2) / 2 + y;
        }
      }
      else {
        iVar4 = (h + y) - iVar2;
      }
      fl_draw_symbol(local_238,iVar8,iVar4,iVar2,iVar2,fl_graphics_driver->color_);
    }
    if (iVar3 != 0) {
      if ((align & 4) == 0) {
        if ((align & 8) == 0) {
          iVar2 = iVar2 + x + uVar19 + (int)(w - (iVar6 + uVar19)) / 2;
        }
        else {
          iVar2 = (w + x) - iVar3;
        }
      }
      else {
        iVar2 = iVar2 + x + uVar19;
      }
      if ((align & 2) == 0) {
        if ((align & 1) == 0) {
          y = (h - iVar3) / 2 + y;
        }
      }
      else {
        y = (h + y) - iVar3;
      }
      fl_draw_symbol(local_139,iVar2,y,iVar3,iVar3,fl_graphics_driver->color_);
    }
    return;
  }
  iVar8 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3b])();
  local_240 = (double)(w - ((int)local_270 + iVar6));
  local_244 = align & 0x80;
  local_270 = CONCAT44(local_270._4_4_,iVar2 + x + uVar15);
  local_24c = x + w;
  local_250 = iVar3 + uVar9;
  local_248 = uVar15 + iVar6 + uVar9;
  do {
    pcVar17 = "";
    if (1 < local_2bc) {
      pcVar17 = expand_text_(pcVar10,&local_258,0,local_240,&local_27c,&local_260,local_244,
                             draw_symbols);
      local_268 = local_260;
    }
    pcVar10 = local_258;
    iVar4 = local_27c;
    uVar9 = (uint)(local_268 + 0.5);
    if ((double)(int)uVar19 < local_268) {
      uVar19 = uVar9;
    }
    iVar14 = (int)local_270;
    if ((align & 4) == 0) {
      if ((align & 8) == 0) {
        iVar14 = (int)(w - (uVar9 + local_248)) / 2 + (int)local_270;
      }
      else {
        iVar14 = local_24c - (uVar9 + local_250);
      }
    }
    (*callthis)(local_258,local_27c,iVar14,uVar16 - iVar8);
    if ((underline_at != (char *)0x0) && (underline_at < pcVar10 + iVar4 && pcVar10 <= underline_at)
       ) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
                (fl_graphics_driver,pcVar10,(ulong)(uint)((int)underline_at - (int)pcVar10));
      (*callthis)("_",1,iVar14 + (int)extraout_XMM0_Qa,uVar16 - iVar8);
    }
    if (*pcVar17 == '@') {
      if (pcVar17[1] != '@') goto LAB_001ea2f5;
    }
    else if (*pcVar17 == '\0') goto LAB_001ea2f5;
    uVar16 = uVar16 + iVar5;
    pcVar10 = pcVar17;
  } while( true );
LAB_001e9c79:
  local_268 = local_260;
  if (iVar3 != 0 || iVar2 != 0) {
    bVar20 = iVar2 != 0;
    iVar2 = 0;
    if (bVar20) {
      iVar2 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
      iVar2 = iVar2 * local_2bc;
    }
    if (iVar3 == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
      iVar3 = iVar3 * local_2bc;
    }
  }
  goto LAB_001e9d13;
}

Assistant:

void fl_draw(
    const char* str,	// the (multi-line) string
    int x, int y, int w, int h,	// bounding box
    Fl_Align align,
    void (*callthis)(const char*,int,int,int),
    Fl_Image* img, int draw_symbols)
{
  char *linebuf = NULL;
  const char* p;
  const char* e;
  int buflen;
  char symbol[2][255], *symptr;
  int symwidth[2], symoffset, symtotal, imgtotal;

  // count how many lines and put the last one into the buffer:
  int lines;
  double width;

  // if the image is set as a backdrop, ignore it here
  if (img && (align & FL_ALIGN_IMAGE_BACKDROP)) img = 0;

  symbol[0][0] = '\0';
  symwidth[0]  = 0;

  symbol[1][0] = '\0';
  symwidth[1]  = 0;

  if (draw_symbols) {
    if (str && str[0] == '@' && str[1] && str[1] != '@') {
      // Start with a symbol...
      for (symptr = symbol[0];
           *str && !isspace(*str) && symptr < (symbol[0] + sizeof(symbol[0]) - 1);
           *symptr++ = *str++) {/*empty*/}
      *symptr = '\0';
      if (isspace(*str)) str++;
      symwidth[0] = (w < h ? w : h);
    }

    if (str && (p = strrchr(str, '@')) != NULL && p > (str + 1) && p[-1] != '@') {
      strlcpy(symbol[1], p, sizeof(symbol[1]));
      symwidth[1] = (w < h ? w : h);
    }
  }

  symtotal = symwidth[0] + symwidth[1];
  imgtotal = (img && (align&FL_ALIGN_IMAGE_NEXT_TO_TEXT)) ? img->w() : 0;

  int strw = 0;
  int strh;

  if (str) {
    for (p = str, lines=0; p;) {
      e = expand_text_(p, linebuf, 0, w - symtotal - imgtotal, buflen, width,
                         align&FL_ALIGN_WRAP, draw_symbols);
      if (strw<width) strw = (int)width;
      lines++;
      if (!*e || (*e == '@' && e[1] != '@' && draw_symbols)) break;
      p = e;
    }
  } else lines = 0;

  if ((symwidth[0] || symwidth[1]) && lines) {
    if (symwidth[0]) symwidth[0] = lines * fl_height();
    if (symwidth[1]) symwidth[1] = lines * fl_height();
  }

  symtotal = symwidth[0] + symwidth[1];
  strh = lines * fl_height();

  // figure out vertical position of the first line:
  int xpos;
  int ypos;
  int height = fl_height();
  int imgvert = ((align&FL_ALIGN_IMAGE_NEXT_TO_TEXT)==0);
  int imgh = img && imgvert ? img->h() : 0;
  int imgw[2] = {0, 0};

  symoffset = 0;

  if (align & FL_ALIGN_BOTTOM) ypos = y+h-(lines-1)*height-imgh;
  else if (align & FL_ALIGN_TOP) ypos = y+height;
  else ypos = y+(h-lines*height-imgh)/2+height;

  // draw the image unless the "text over image" alignment flag is set...
  if (img && imgvert && !(align & FL_ALIGN_TEXT_OVER_IMAGE)) {
    if (img->w() > symoffset) symoffset = img->w();

    if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0];
    else if (align & FL_ALIGN_RIGHT) xpos = x + w - img->w() - symwidth[1];
    else xpos = x + (w - img->w() - symtotal) / 2 + symwidth[0];

    img->draw(xpos, ypos - height);
    ypos += img->h();
  }

  // draw the image to the side of the text
  if (img && !imgvert /* && (align & !FL_ALIGN_TEXT_NEXT_TO_IMAGE)*/ ) {
    if (align & FL_ALIGN_TEXT_OVER_IMAGE) { // image is right of text
      imgw[1] = img->w();
      if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0] + strw + 1;
      else if (align & FL_ALIGN_RIGHT) xpos = x + w - symwidth[1] - imgw[1] + 1;
      else xpos = x + (w - strw - symtotal - imgw[1]) / 2 + symwidth[0] + strw + 1;
    } else { // image is to the left of the text
      imgw[0] = img->w();
      if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0] - 1;
      else if (align & FL_ALIGN_RIGHT) xpos = x + w - symwidth[1] - strw - imgw[0] - 1;
      else xpos = x + (w - strw - symtotal - imgw[0]) / 2 - 1;
    }
    int yimg = ypos - height;
    if (align & FL_ALIGN_TOP) ;
    else if (align & FL_ALIGN_BOTTOM) yimg += strh - img->h() - 1;
    else yimg += (strh - img->h() - 1) / 2;
    img->draw(xpos, yimg);
  }

  // now draw all the lines:
  if (str) {
    int desc = fl_descent();
    for (p=str; ; ypos += height) {
      if (lines>1) e = expand_text_(p, linebuf, 0, w - symtotal - imgtotal, buflen,
				width, align&FL_ALIGN_WRAP, draw_symbols);
      else e = "";

      if (width > symoffset) symoffset = (int)(width + 0.5);

      if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0] + imgw[0];
      else if (align & FL_ALIGN_RIGHT) xpos = x + w - (int)(width + .5) - symwidth[1] - imgw[1];
      else xpos = x + (w - (int)(width + .5) - symtotal - imgw[0] - imgw[1]) / 2 + symwidth[0] + imgw[0];

      callthis(linebuf,buflen,xpos,ypos-desc);

      if (underline_at && underline_at >= linebuf && underline_at < (linebuf + buflen))
	callthis("_",1,xpos+int(fl_width(linebuf,(int) (underline_at-linebuf))),ypos-desc);

      if (!*e || (*e == '@' && e[1] != '@')) break;
      p = e;
    }
  }

  // draw the image if the "text over image" alignment flag is set...
  if (img && imgvert && (align & FL_ALIGN_TEXT_OVER_IMAGE)) {
    if (img->w() > symoffset) symoffset = img->w();

    if (align & FL_ALIGN_LEFT) xpos = x + symwidth[0];
    else if (align & FL_ALIGN_RIGHT) xpos = x + w - img->w() - symwidth[1];
    else xpos = x + (w - img->w() - symtotal) / 2 + symwidth[0];

    img->draw(xpos, ypos);
  }

  // draw the symbols, if any...
  if (symwidth[0]) {
    // draw to the left
    if (align & FL_ALIGN_LEFT) xpos = x;
    else if (align & FL_ALIGN_RIGHT) xpos = x + w - symtotal - symoffset;
    else xpos = x + (w - symoffset - symtotal) / 2;

    if (align & FL_ALIGN_BOTTOM) ypos = y + h - symwidth[0];
    else if (align & FL_ALIGN_TOP) ypos = y;
    else ypos = y + (h - symwidth[0]) / 2;

    fl_draw_symbol(symbol[0], xpos, ypos, symwidth[0], symwidth[0], fl_color());
  }

  if (symwidth[1]) {
    // draw to the right
    if (align & FL_ALIGN_LEFT) xpos = x + symoffset + symwidth[0];
    else if (align & FL_ALIGN_RIGHT) xpos = x + w - symwidth[1];
    else xpos = x + (w - symoffset - symtotal) / 2 + symoffset + symwidth[0];

    if (align & FL_ALIGN_BOTTOM) ypos = y + h - symwidth[1];
    else if (align & FL_ALIGN_TOP) ypos = y;
    else ypos = y + (h - symwidth[1]) / 2;

    fl_draw_symbol(symbol[1], xpos, ypos, symwidth[1], symwidth[1], fl_color());
  }
}